

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_neg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  int opsize;
  TCGv_i32 pTVar1;
  TCGv_i32 ret;
  undefined6 in_register_00000012;
  uintptr_t o;
  TCGv_i32 addr;
  
  tcg_ctx = s->uc->tcg_ctx;
  opsize = insn_opsize((int)CONCAT62(in_register_00000012,insn));
  pTVar1 = gen_ea(env,s,insn,opsize,tcg_ctx->NULL_QREG,&addr,EA_LOADS,
                  (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != tcg_ctx->NULL_QREG) {
    ret = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_neg_i32(tcg_ctx,ret,pTVar1);
    set_cc_op(s,opsize + CC_OP_SUBB);
    gen_update_cc_add(tcg_ctx,ret,pTVar1,opsize);
    tcg_gen_setcondi_i32_m68k(tcg_ctx,TCG_COND_NE,QREG_CC_X,ret,0);
    pTVar1 = gen_ea(env,s,insn,opsize,ret,&addr,EA_STORE,
                    (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar1 != tcg_ctx->NULL_QREG) {
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      return;
    }
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(neg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src1;
    TCGv dest;
    TCGv addr;
    int opsize;

    opsize = insn_opsize(insn);
    SRC_EA(env, src1, opsize, 1, &addr);
    dest = tcg_temp_new(tcg_ctx);
    tcg_gen_neg_i32(tcg_ctx, dest, src1);
    set_cc_op(s, CC_OP_SUBB + opsize);
    gen_update_cc_add(tcg_ctx, dest, src1, opsize);
    tcg_gen_setcondi_i32(tcg_ctx, TCG_COND_NE, QREG_CC_X, dest, 0);
    DEST_EA(env, insn, opsize, dest, &addr);
    tcg_temp_free(tcg_ctx, dest);
}